

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.h
# Opt level: O0

typed_value<std::vector<bool,_std::allocator<bool>_>,_char> * __thiscall
VW::config::options_boost_po::add_notifier<bool>
          (options_boost_po *this,shared_ptr<VW::config::typed_option<bool>_> *opt,
          typed_value<std::vector<bool,_std::allocator<bool>_>,_char> *po_value)

{
  typed_value<std::vector<bool,_std::allocator<bool>_>,_char> *ptVar1;
  function1<void,_const_std::vector<bool,_std::allocator<bool>_>_&> *in_stack_ffffffffffffff88;
  typed_value<std::vector<bool,_std::allocator<bool>_>,_char> *in_stack_ffffffffffffff90;
  type_conflict4 in_stack_ffffffffffffffc4;
  functor_type *in_stack_ffffffffffffffc8;
  function1<void,_const_std::vector<bool,_std::allocator<bool>_>_&> *in_stack_ffffffffffffffd0;
  
  std::shared_ptr<VW::config::typed_option<bool>_>::shared_ptr
            ((shared_ptr<VW::config::typed_option<bool>_> *)in_stack_ffffffffffffff90,
             (shared_ptr<VW::config::typed_option<bool>_> *)in_stack_ffffffffffffff88);
  boost::function1<void,std::vector<bool,std::allocator<bool>>const&>::
  function1<VW::config::options_boost_po::add_notifier<bool>(std::shared_ptr<VW::config::typed_option<bool>>&,boost::program_options::typed_value<std::vector<bool,std::allocator<bool>>,char>*)::_lambda(std::vector<bool,std::allocator<bool>>)_1_>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  ptVar1 = boost::program_options::typed_value<std::vector<bool,_std::allocator<bool>_>,_char>::
           notifier(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  boost::function1<void,_const_std::vector<bool,_std::allocator<bool>_>_&>::~function1
            ((function1<void,_const_std::vector<bool,_std::allocator<bool>_>_&> *)0x3330b4);
  add_notifier<bool>(std::shared_ptr<VW::config::typed_option<bool>>&,boost::program_options::typed_value<std::vector<bool,std::allocator<bool>>,char>*)
  ::{lambda(std::vector<bool,std::allocator<bool>>)#1}::~shared_ptr((functor_type *)0x3330be);
  return ptVar1;
}

Assistant:

po::typed_value<std::vector<T>>* options_boost_po::add_notifier(
    std::shared_ptr<typed_option<T>>& opt, po::typed_value<std::vector<T>>* po_value)
{
  return po_value->notifier([opt](std::vector<T> final_arguments) {
    T first = final_arguments[0];
    for (auto const& item : final_arguments)
    {
      if (item != first)
      {
        std::stringstream ss;
        ss << "Disagreeing option values for '" << opt->m_name << "': '" << first << "' vs '" << item << "'";
        THROW_EX(VW::vw_argument_disagreement_exception, ss.str());
      }
    }

    // Set the value for the listening location.
    opt->m_location = first;
    opt->value(first);
  });
}